

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O3

void __thiscall QCompleter::setWidget(QCompleter *this,QWidget *widget)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  QWidget *pQVar4;
  
  lVar1 = *(long *)&this->field_0x8;
  lVar3 = *(long *)(lVar1 + 0x78);
  if (lVar3 == 0) {
    if (widget == (QWidget *)0x0) {
      return;
    }
  }
  else {
    if (*(int *)(lVar3 + 4) == 0) {
      pQVar4 = (QWidget *)0x0;
    }
    else {
      pQVar4 = *(QWidget **)(lVar1 + 0x80);
    }
    if (pQVar4 == widget) {
      return;
    }
    if ((*(int *)(lVar3 + 4) != 0) && (*(QObject **)(lVar1 + 0x80) != (QObject *)0x0)) {
      QObject::removeEventFilter(*(QObject **)(lVar1 + 0x80));
    }
    if (widget == (QWidget *)0x0) {
      lVar3 = 0;
      goto LAB_0064bd52;
    }
  }
  lVar3 = QtSharedPointer::ExternalRefCountData::getAndRef(&widget->super_QObject);
LAB_0064bd52:
  piVar2 = *(int **)(lVar1 + 0x78);
  *(long *)(lVar1 + 0x78) = lVar3;
  *(QWidget **)(lVar1 + 0x80) = widget;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
    lVar3 = *(long *)(lVar1 + 0x78);
  }
  if (((lVar3 != 0) && (*(int *)(lVar3 + 4) != 0)) &&
     (*(QObject **)(lVar1 + 0x80) != (QObject *)0x0)) {
    QObject::installEventFilter(*(QObject **)(lVar1 + 0x80));
  }
  if (*(QWidget **)(lVar1 + 0x90) == (QWidget *)0x0) {
    return;
  }
  QWidget::hide(*(QWidget **)(lVar1 + 0x90));
  if ((*(long *)(lVar1 + 0x78) == 0) || (*(int *)(*(long *)(lVar1 + 0x78) + 4) == 0)) {
    pQVar4 = (QWidget *)0x0;
  }
  else {
    pQVar4 = *(QWidget **)(lVar1 + 0x80);
  }
  QWidget::setFocusProxy(*(QWidget **)(lVar1 + 0x90),pQVar4);
  return;
}

Assistant:

void QCompleter::setWidget(QWidget *widget)
{
    Q_D(QCompleter);
    if (widget == d->widget)
        return;

    if (d->widget)
        d->widget->removeEventFilter(this);
    d->widget = widget;
    if (d->widget)
        d->widget->installEventFilter(this);

    if (d->popup) {
        d->popup->hide();
        d->popup->setFocusProxy(d->widget);
    }
}